

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O1

void ut::
     are_equal<agge::tests::mocks::path::point,2ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
               (point (*expected) [2],
               vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
               *actual,LocationInfo *location)

{
  point *rhs;
  bool bVar1;
  FailedAssertion *pFVar2;
  long lVar3;
  string local_48;
  
  rhs = (actual->
        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(actual->
            super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)rhs != 0x18) {
    pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar2,&local_48,location);
    __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  bVar1 = agge::tests::mocks::path::point::operator==(*expected,rhs);
  if (bVar1) {
    lVar3 = 0;
    do {
      if (lVar3 == 0xc) {
        return;
      }
      bVar1 = agge::tests::mocks::path::point::operator==
                        ((point *)((long)&(*expected)[1].x + lVar3),
                         (point *)((long)&rhs[1].x + lVar3));
      lVar3 = lVar3 + 0xc;
    } while (bVar1);
  }
  pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar2,&local_48,location);
  __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}